

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

char * __thiscall MemoryEditor::FormatBinary(MemoryEditor *this,uint8_t *buf,int width)

{
  char local_35;
  int local_34;
  int local_30;
  int i;
  int j;
  int n;
  size_t out_n;
  int width_local;
  uint8_t *buf_local;
  MemoryEditor *this_local;
  
  if (0x40 < width) {
    __assert_fail("width <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                  ,0x270,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
  }
  _j = 0;
  local_30 = width / 8;
  while (local_30 = local_30 + -1, -1 < local_30) {
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      local_35 = '1';
      if (((uint)buf[local_30] & 1 << (7U - (char)local_34 & 0x1f)) == 0) {
        local_35 = '0';
      }
      FormatBinary::out_buf[_j] = local_35;
      _j = _j + 1;
    }
    FormatBinary::out_buf[_j] = ' ';
    _j = _j + 1;
  }
  if (_j < 0x49) {
    FormatBinary::out_buf[_j] = '\0';
    return FormatBinary::out_buf;
  }
  __assert_fail("out_n < ((int)(sizeof(out_buf) / sizeof(*(out_buf))))",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                ,0x27a,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
}

Assistant:

const char* FormatBinary(const uint8_t* buf, int width) const
    {
        IM_ASSERT(width <= 64);
        size_t out_n = 0;
        static char out_buf[64 + 8 + 1];
        int n = width / 8;
        for (int j = n - 1; j >= 0; --j)
        {
            for (int i = 0; i < 8; ++i)
                out_buf[out_n++] = (buf[j] & (1 << (7 - i))) ? '1' : '0';
            out_buf[out_n++] = ' ';
        }
        IM_ASSERT(out_n < IM_ARRAYSIZE(out_buf));
        out_buf[out_n] = 0;
        return out_buf;
    }